

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

kTRContinueMode __thiscall
trun::TestResponseProxy::AssertError(TestResponseProxy *this,char *exp,char *file,int line)

{
  Config *pCVar1;
  TestResponseProxy *this_00;
  bool bVar2;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  
  gnilk::Log::Debug<char_const*,char_const*,int,char_const*>
            (this->pLogger,"Assert Error: %s:%d\t\'%s\'",file,line,exp);
  printf("*** ASSERT ERROR: %s:%d\t\'%s\'\n",file,(ulong)(uint)line,exp);
  this->assertCount = this->assertCount + 1;
  if (this->testResult == kTestResult_Pass) {
    this->testResult = kTestResult_TestFail;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc0,file,&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,exp,&local_62);
  trun::AssertError::Add
            (&this->assertError,kAssert_Error,line,(string *)&stack0xffffffffffffffc0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = (TestResponseProxy *)&stack0xffffffffffffffc0;
  std::__cxx11::string::~string((string *)this_00);
  pCVar1 = Config::Instance();
  bVar2 = pCVar1->continueOnAssert == false;
  if (bVar2) {
    TerminateThreadIfNeeded(this_00);
  }
  return (uint)!bVar2;
}

Assistant:

kTRContinueMode TestResponseProxy::AssertError(const char *exp, const char *file, const int line) {
    pLogger->Debug("Assert Error: %s:%d\t'%s'", file, line, exp);
    printf("*** ASSERT ERROR: %s:%d\t'%s'\n", file, line, exp);

    this->assertCount++;
    if (testResult < kTestResult_TestFail) {
        testResult = kTestResult_TestFail;
    }
    assertError.Add(AssertError::kAssert_Error, line, file, exp);
    if (Config::Instance().continueOnAssert) {
        return kTRContinueMode::kTRContinue;
    }
    TerminateThreadIfNeeded();
    return kTRContinueMode::kTRLeave;
}